

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_t.cpp
# Opt level: O0

int __thiscall deci::ast_binary_t::Generate(ast_binary_t *this,ostream *output,int pc)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  int pc_local;
  ostream *output_local;
  ast_binary_t *this_local;
  
  uVar1 = (*this->a->_vptr_ast_item_t[2])(this->a,output,(ulong)(uint)pc);
  iVar2 = (*this->b->_vptr_ast_item_t[2])(this->b,output,(ulong)uVar1);
  poVar3 = std::operator<<(output,"bin ");
  poVar3 = std::operator<<(poVar3,(string *)&this->identifier);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  return iVar2 + 1;
}

Assistant:

int ast_binary_t::Generate(std::ostream& output, int pc) const {
    pc = this->a->Generate(output, pc);
    pc = this->b->Generate(output, pc);
    output << "bin " << this->identifier << std::endl;
    return pc + 1;
  }